

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_entt_entity_editor.hpp
# Opt level: O0

ComponentInfo * __thiscall
MM::EntityEditor<entt::entity>::registerComponent<Components::Velocity>
          (EntityEditor<entt::entity> *this,string *name)

{
  ComponentInfo *pCVar1;
  Callback local_38;
  string *local_18;
  string *name_local;
  EntityEditor<entt::entity> *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::function<void(entt::basic_registry<entt::entity>&,entt::entity)>::
  function<void(&)(entt::basic_registry<entt::entity>&,entt::entity),void>
            ((function<void(entt::basic_registry<entt::entity>&,entt::entity)> *)&local_38,
             ComponentEditorWidget<Components::Velocity,entt::entity>);
  pCVar1 = registerComponent<Components::Velocity>(this,name,&local_38);
  std::function<void_(entt::basic_registry<entt::entity>_&,_entt::entity)>::~function(&local_38);
  return pCVar1;
}

Assistant:

ComponentInfo& registerComponent(const std::string& name)
	{
		return registerComponent<Component>(name, ComponentEditorWidget<Component, EntityType>);
	}